

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::texStorage2D
          (ReferenceContext *this,deUint32 target,int levels,deUint32 internalFormat,int width,
          int height)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int iVar4;
  TextureCube *local_90;
  Texture2D *local_88;
  CubeFace local_70;
  int face;
  int levelH_1;
  int levelW_1;
  int level_1;
  TextureCube *texture_1;
  int levelH;
  int levelW;
  int level;
  Texture2D *texture;
  TextureFormat local_38;
  TextureFormat storageFmt;
  TextureUnit *unit;
  int height_local;
  int width_local;
  deUint32 internalFormat_local;
  int levels_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  storageFmt = (TextureFormat)
               std::
               vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
               ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  tcu::TextureFormat::TextureFormat(&local_38);
  do {
    if ((width < 1) || (height < 1)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    iVar3 = de::max<int>(width,height);
    iVar3 = deLog2Floor32(iVar3);
    bVar1 = de::inRange<int>(levels,1,iVar3 + 1);
    if (!bVar1) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  local_38 = mapInternalFormat(internalFormat);
  do {
    if ((local_38.order == CHANNELORDER_LAST) || (local_38.type == CHANNELTYPE_LAST)) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (target == 0xde1) {
    if (*(long *)((long)storageFmt + 8) == 0) {
      local_88 = (Texture2D *)((long)storageFmt + 0x5e0);
    }
    else {
      local_88 = *(Texture2D **)((long)storageFmt + 8);
    }
    do {
      if (((this->m_limits).maxTexture2DSize < width) ||
         ((this->m_limits).maxTexture2DSize <= height)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      bVar1 = rc::Texture::isImmutable(&local_88->super_Texture);
      if (bVar1) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    rc::Texture2D::clearLevels(local_88);
    rc::Texture::setImmutable(&local_88->super_Texture);
    for (levelH = 0; levelH < levels; levelH = levelH + 1) {
      iVar3 = de::max<int>(1,width >> ((byte)levelH & 0x1f));
      iVar4 = de::max<int>(1,height >> ((byte)levelH & 0x1f));
      rc::Texture2D::allocLevel(local_88,levelH,&local_38,iVar3,iVar4);
    }
  }
  else if (target == 0x8513) {
    if (*(long *)((long)storageFmt + 0x10) == 0) {
      local_90 = (TextureCube *)((long)storageFmt + 0xb90);
    }
    else {
      local_90 = *(TextureCube **)((long)storageFmt + 0x10);
    }
    do {
      if (((this->m_limits).maxTextureCubeSize < width) ||
         ((this->m_limits).maxTextureCubeSize < height)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      bVar1 = rc::Texture::isImmutable(&local_90->super_Texture);
      if (bVar1) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    rc::TextureCube::clearLevels(local_90);
    rc::Texture::setImmutable(&local_90->super_Texture);
    for (levelH_1 = 0; levelH_1 < levels; levelH_1 = levelH_1 + 1) {
      iVar3 = de::max<int>(1,width >> ((byte)levelH_1 & 0x1f));
      iVar4 = de::max<int>(1,height >> ((byte)levelH_1 & 0x1f));
      for (local_70 = CUBEFACE_NEGATIVE_X; (int)local_70 < 6;
          local_70 = local_70 + CUBEFACE_POSITIVE_X) {
        rc::TextureCube::allocFace(local_90,levelH_1,local_70,&local_38,iVar3,iVar4);
      }
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::texStorage2D (deUint32 target, int levels, deUint32 internalFormat, int width, int height)
{
	TextureUnit&		unit		= m_textureUnits[m_activeTexture];
	TextureFormat		storageFmt;

	RC_IF_ERROR(width <= 0 || height <= 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(!de::inRange(levels, 1, (int)deLog2Floor32(de::max(width, height))+1), GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height >= m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			texture.allocLevel(level, storageFmt, levelW, levelH);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		TextureCube& texture = unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;

		RC_IF_ERROR(width > m_limits.maxTextureCubeSize || height > m_limits.maxTextureCubeSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				texture.allocFace(level, (tcu::CubeFace)face, storageFmt, levelW, levelH);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}